

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::AsyncIoStreamWithGuards::whenWriteDisconnected(AsyncIoStreamWithGuards *this)

{
  SourceLocation location;
  AsyncIoStream *pAVar1;
  long in_RSI;
  SourceLocation local_48;
  Type local_28 [8];
  ForkedPromise<void> local_20;
  AsyncIoStreamWithGuards *this_local;
  
  this_local = this;
  if ((*(byte *)(in_RSI + 0x49) & 1) == 0) {
    ForkedPromise<void>::addBranch(&local_20);
    SourceLocation::SourceLocation
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"whenWriteDisconnected",0x1290,0xe);
    location.function = local_48.function;
    location.fileName = local_48.fileName;
    location.lineNumber = local_48.lineNumber;
    location.columnNumber = local_48.columnNumber;
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::whenWriteDisconnected()::_lambda()_1_,kj::AsyncIoStreamWithGuards::whenWriteDisconnected()::_lambda(kj::Exception&&)_1_>
              ((Promise<void> *)this,(Type *)&local_20,local_28,location);
    Promise<void>::~Promise((Promise<void> *)&local_20);
  }
  else {
    pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(in_RSI + 0x18));
    (*(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream[3])
              (this,&pAVar1->super_AsyncOutputStream);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    if (writeGuardReleased) {
      return inner->whenWriteDisconnected();
    } else {
      return writeGuard.addBranch().then([this]() {
        return inner->whenWriteDisconnected();
      }, [](kj::Exception&& e) mutable -> kj::Promise<void> {
        if (e.getType() == kj::Exception::Type::DISCONNECTED) {
          return kj::READY_NOW;
        } else {
          return kj::mv(e);
        }
      });
    }
  }